

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltimerquery.cpp
# Opt level: O0

void __thiscall QOpenGLTimeMonitorPrivate::recordSample(QOpenGLTimeMonitorPrivate *this)

{
  int iVar1;
  qsizetype qVar2;
  long in_RDI;
  GLenum in_stack_ffffffffffffffc8;
  GLuint in_stack_ffffffffffffffcc;
  QOpenGLQueryHelper *in_stack_ffffffffffffffd0;
  QOpenGLQueryHelper *this_00;
  
  if (*(long *)(in_RDI + 0xb8) == 0) {
    *(int *)(in_RDI + 0xc4) = *(int *)(in_RDI + 0xc4) + 1;
    QList<unsigned_int>::at
              ((QList<unsigned_int> *)in_stack_ffffffffffffffd0,
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    QOpenGLQueryHelper::glQueryCounter
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  else if (*(int *)(in_RDI + 0xc4) == -1) {
    *(int *)(in_RDI + 0xc4) = *(int *)(in_RDI + 0xc4) + 1;
    QList<unsigned_int>::at
              ((QList<unsigned_int> *)in_stack_ffffffffffffffd0,
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    QOpenGLQueryHelper::glBeginQuery
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    *(undefined1 *)(in_RDI + 200) = 1;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0xc4);
    qVar2 = QList<unsigned_int>::size((QList<unsigned_int> *)(in_RDI + 0x78));
    if ((long)iVar1 < qVar2 + -1) {
      QOpenGLQueryHelper::glEndQuery(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      this_00 = *(QOpenGLQueryHelper **)(in_RDI + 0xb0);
      *(int *)(in_RDI + 0xc4) = *(int *)(in_RDI + 0xc4) + 1;
      QList<unsigned_int>::at
                ((QList<unsigned_int> *)this_00,
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      QOpenGLQueryHelper::glBeginQuery(this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    }
    else if ((*(byte *)(in_RDI + 200) & 1) != 0) {
      QOpenGLQueryHelper::glEndQuery(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      *(undefined1 *)(in_RDI + 200) = 0;
    }
  }
  return;
}

Assistant:

void QOpenGLTimeMonitorPrivate::recordSample()
{
    // Use glQueryCounter() and GL_TIMESTAMP where available.
    // Otherwise, simulate it with glBeginQuery()/glEndQuery()
    if (!ext) {
#if defined(GL_TIMESTAMP)
        core->glQueryCounter(timers.at(++currentSample), GL_TIMESTAMP);
#endif
    } else {
        if (currentSample == -1) {
            core->glBeginQuery(GL_TIME_ELAPSED_EXT, timers.at(++currentSample));
            timerQueryActive = true;
        } else if (currentSample < timers.size() - 1) {
            core->glEndQuery(GL_TIME_ELAPSED_EXT);
            core->glBeginQuery(GL_TIME_ELAPSED_EXT, timers.at(++currentSample));
        } else {
            if (timerQueryActive) {
                core->glEndQuery(GL_TIME_ELAPSED_EXT);
                timerQueryActive = false;
            }
        }
    }
}